

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gb_emu.c
# Opt level: O0

void gb_emu_deinit(gb_emu_t *gb_emu)

{
  gb_t *gb;
  gb_emu_t *gb_emu_local;
  
  if (gb_emu != (gb_emu_t *)0x0) {
    if ((gb_emu->cart_inserted & 1U) != 0) {
      cart_deinit(&gb_emu->cart);
    }
    ppu_deinit(&(gb_emu->gb).ppu);
    mmu_deinit(&(gb_emu->gb).mmu);
    return;
  }
  __assert_fail("gb_emu != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/loochek[P]gameboy/src/core/gb_emu.c"
                ,0x85,"void gb_emu_deinit(gb_emu_t *)");
}

Assistant:

void gb_emu_deinit(gb_emu_t *gb_emu)
{
    assert(gb_emu != NULL);

    gb_t *gb = &gb_emu->gb;

    if (gb_emu->cart_inserted)
        cart_deinit(&gb_emu->cart);

    ppu_deinit(&gb->ppu);
    mmu_deinit(&gb->mmu);
}